

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zopflipng_bin.cc
# Opt level: O0

void GetFileNameParts(string *filename,string *dir,string *file,string *ext)

{
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_t dotpos;
  string nodir;
  size_t slashpos;
  size_t npos;
  string local_e8 [32];
  string local_c8 [32];
  long local_a8;
  string local_a0 [32];
  string local_80 [48];
  string local_50 [32];
  long local_30;
  long local_28;
  string *local_20;
  string *local_18;
  string *local_10;
  string *local_8;
  
  local_28 = -1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_30 = std::__cxx11::string::find_last_of((char *)in_RDI,0x15a13c);
  std::__cxx11::string::string(local_50);
  if (local_30 == local_28) {
    std::__cxx11::string::operator=(local_10,"");
    std::__cxx11::string::operator=(local_50,local_8);
  }
  else {
    std::__cxx11::string::substr((ulong)local_80,(ulong)local_8);
    std::__cxx11::string::operator=(local_10,local_80);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::substr((ulong)local_a0,(ulong)local_8);
    std::__cxx11::string::operator=(local_50,local_a0);
    std::__cxx11::string::~string(local_a0);
  }
  local_a8 = std::__cxx11::string::find_last_of((char)local_50,0x2e);
  if (local_a8 == -1) {
    std::__cxx11::string::operator=(local_18,local_50);
    std::__cxx11::string::operator=(local_20,"");
  }
  else {
    std::__cxx11::string::substr((ulong)local_c8,(ulong)local_50);
    std::__cxx11::string::operator=(local_18,local_c8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::substr((ulong)local_e8,(ulong)local_50);
    std::__cxx11::string::operator=(local_20,local_e8);
    std::__cxx11::string::~string(local_e8);
  }
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void GetFileNameParts(const std::string& filename,
    std::string* dir, std::string* file, std::string* ext) {
  size_t npos = (size_t)(-1);
  size_t slashpos = filename.find_last_of("/\\");
  std::string nodir;
  if (slashpos == npos) {
    *dir = "";
    nodir = filename;
  } else {
    *dir = filename.substr(0, slashpos + 1);
    nodir = filename.substr(slashpos + 1);
  }
  size_t dotpos = nodir.find_last_of('.');
  if (dotpos == (size_t)(-1)) {
    *file = nodir;
    *ext = "";
  } else {
    *file = nodir.substr(0, dotpos);
    *ext = nodir.substr(dotpos);
  }
}